

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<int>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<int> min,WrappedType<int> max,float gridSize)

{
  bool bVar1;
  WrappedType<int> WVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  int local_128;
  int i_1;
  int i;
  WrappedType<int> local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  WrappedType<int> local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  Int local_c4;
  WrappedType<int> local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  WrappedType<int> local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  Int local_a0;
  WrappedType<int> local_9c;
  int local_98;
  int local_94;
  int local_90;
  WrappedType<int> local_8c;
  int local_88;
  int local_84;
  WrappedType<int> local_80;
  int attemptNdx;
  WrappedType<int> w;
  WrappedType<int> z;
  WrappedType<int> y2;
  WrappedType<int> y1;
  WrappedType<int> x2;
  WrappedType<int> x1;
  int quadNdx;
  WrappedType<int> local_5c;
  WrappedType<int> minDiff;
  WrappedType<int> minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  WrappedType<int> max_local;
  WrappedType<int> min_local;
  
  seed_local = min.m_value;
  count_local = max.m_value;
  resultData._4_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)(componentCount * 4);
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._4_4_ = (int)gridSize_local * 6;
  }
  pcVar3 = (char *)operator_new__((long)(offset + resultData._4_4_ * count));
  deRandom_init((deRandom *)&minDiff,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar4 = gls::GLValue::WrappedType<int>::to<float>((WrappedType<int> *)&count_local);
    fVar5 = gls::GLValue::WrappedType<int>::to<float>((WrappedType<int> *)&seed_local);
    fVar4 = deFloatAbs(fVar4 - fVar5);
    local_5c = gls::GLValue::WrappedType<int>::fromFloat(fVar4 * gridSize);
    x1.m_value = (int)minValue<deqp::gls::GLValue::WrappedType<int>>();
    bVar1 = gls::GLValue::WrappedType<int>::operator>(&x1,&local_5c);
    if (bVar1) {
      quadNdx = (int)minValue<deqp::gls::GLValue::WrappedType<int>>();
    }
    else {
      quadNdx = local_5c.m_value;
    }
    for (x2.m_value = 0; x2.m_value < count; x2.m_value = x2.m_value + 1) {
      for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
        local_90 = seed_local;
        local_94 = count_local;
        local_8c.m_value =
             (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                            ((deRandom *)&minDiff,seed_local,count_local);
        local_88 = (int)roundTo<deqp::gls::GLValue::WrappedType<int>>
                                  ((WrappedType<int> *)&quadNdx,&local_8c);
        local_a0.m_value = quadNdx;
        y1.m_value = local_88;
        local_a8 = (int)gls::GLValue::WrappedType<int>::operator-
                                  ((WrappedType<int> *)&count_local,&y1);
        local_a4 = (int)abs<deqp::gls::GLValue::WrappedType<int>>((Int)local_a8);
        local_9c.m_value =
             (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                            ((deRandom *)&minDiff,local_a0,(Int)local_a4);
        local_98 = (int)roundTo<deqp::gls::GLValue::WrappedType<int>>
                                  ((WrappedType<int> *)&quadNdx,&local_9c);
        local_b4 = seed_local;
        local_b8 = count_local;
        y2.m_value = local_98;
        local_b0.m_value =
             (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                            ((deRandom *)&minDiff,seed_local,count_local);
        local_ac = (int)roundTo<deqp::gls::GLValue::WrappedType<int>>
                                  ((WrappedType<int> *)&quadNdx,&local_b0);
        local_c4.m_value = quadNdx;
        z.m_value = local_ac;
        local_cc = (int)gls::GLValue::WrappedType<int>::operator-
                                  ((WrappedType<int> *)&count_local,&z);
        local_c8 = (int)abs<deqp::gls::GLValue::WrappedType<int>>((Int)local_cc);
        local_c0.m_value =
             (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                            ((deRandom *)&minDiff,local_c4,(Int)local_c8);
        local_bc = (int)roundTo<deqp::gls::GLValue::WrappedType<int>>
                                  ((WrappedType<int> *)&quadNdx,&local_c0);
        w = (WrappedType<int>)local_bc;
        if (componentCount < 3) {
          local_d0 = (int)gls::GLValue::WrappedType<int>::create(0);
        }
        else {
          local_d8 = seed_local;
          local_dc = count_local;
          local_d4.m_value =
               (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                              ((deRandom *)&minDiff,seed_local,count_local);
          local_d0 = (int)roundTo<deqp::gls::GLValue::WrappedType<int>>
                                    ((WrappedType<int> *)&quadNdx,&local_d4);
        }
        attemptNdx = local_d0;
        if (componentCount < 4) {
          local_e0 = (int)gls::GLValue::WrappedType<int>::create(1);
        }
        else {
          local_e4.m_value =
               (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                              ((deRandom *)&minDiff,seed_local,count_local);
          local_e0 = (int)roundTo<deqp::gls::GLValue::WrappedType<int>>
                                    ((WrappedType<int> *)&quadNdx,&local_e4);
        }
        local_80.m_value = local_e0;
        if (componentCount < 3) break;
        fVar4 = gls::GLValue::WrappedType<int>::to<float>(&y2);
        fVar5 = gls::GLValue::WrappedType<int>::to<float>((WrappedType<int> *)&attemptNdx);
        fVar4 = deFloatAbs(fVar4 + fVar5);
        fVar5 = gls::GLValue::WrappedType<int>::to<float>((WrappedType<int> *)&quadNdx);
        if (fVar5 <= fVar4) {
          fVar4 = gls::GLValue::WrappedType<int>::to<float>(&w);
          fVar5 = gls::GLValue::WrappedType<int>::to<float>(&local_80);
          fVar4 = deFloatAbs(fVar4 + fVar5);
          fVar5 = gls::GLValue::WrappedType<int>::to<float>((WrappedType<int> *)&quadNdx);
          if (fVar5 <= fVar4) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_) + (long)offset,y1);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + 4) + (long)offset,z);
      WVar2 = gls::GLValue::WrappedType<int>::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local) + (long)offset
                 ,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local + 4) +
                          (long)offset,z);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 2) +
                          (long)offset,y1);
      WVar2 = gls::GLValue::WrappedType<int>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 2 + 4) +
                          (long)offset,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 3) +
                          (long)offset,y1);
      WVar2 = gls::GLValue::WrappedType<int>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 3 + 4) +
                          (long)offset,WVar2);
      WVar2 = gls::GLValue::WrappedType<int>::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 4) +
                          (long)offset,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 4 + 4) +
                          (long)offset,z);
      WVar2 = gls::GLValue::WrappedType<int>::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 5) +
                          (long)offset,WVar2);
      WVar2 = gls::GLValue::WrappedType<int>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * 5 + 4) +
                          (long)offset,WVar2);
      if (2 < componentCount) {
        for (i_1 = 0; i_1 < 6; i_1 = i_1 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                    (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * i_1 + 8)
                              + (long)offset,(WrappedType<int>)attemptNdx);
        }
      }
      if (3 < componentCount) {
        for (local_128 = 0; local_128 < 6; local_128 = local_128 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                    (pcVar3 + (long)(x2.m_value * resultData._4_4_ + (int)gridSize_local * local_128
                                    + 0xc) + (long)offset,local_80);
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}